

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

CRef __thiscall
Minisat::ClauseAllocator::alloc<Minisat::vec<Minisat::Lit>>
          (ClauseAllocator *this,vec<Minisat::Lit> *ps,bool learnt)

{
  Ref RVar1;
  uint uVar2;
  undefined7 in_register_00000011;
  
  uVar2 = 2;
  if ((int)CONCAT71(in_register_00000011,learnt) == 0) {
    uVar2 = (uint)(byte)(this->super_RegionAllocator<unsigned_int>).field_0x14;
  }
  RVar1 = RegionAllocator<unsigned_int>::alloc
                    (&this->super_RegionAllocator<unsigned_int>,ps->sz + uVar2 + 2);
  Clause::Clause<Minisat::vec<Minisat::Lit>>
            ((Clause *)((this->super_RegionAllocator<unsigned_int>).memory + RVar1),ps,
             (bool)(this->super_RegionAllocator<unsigned_int>).field_0x14,learnt);
  return RVar1;
}

Assistant:

CRef alloc(const Lits &ps, bool learnt = false)
    {
        assert(sizeof(Lit) == sizeof(uint32_t));
        assert(sizeof(float) == sizeof(uint32_t));
        int extras = learnt ? 2 : (int)extra_clause_field;

        CRef cid = RegionAllocator<uint32_t>::alloc(clauseWord32Size(ps.size(), extras));
        new (lea(cid)) Clause(ps, extra_clause_field, learnt);

        return cid;
    }